

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRGenerator.cc
# Opt level: O2

Value * __thiscall flow::lang::IRGenerator::codegen(IRGenerator *this,Stmt *stmt)

{
  Value *pVVar1;
  
  if (stmt == (Stmt *)0x0) {
    this->result_ = (Value *)0x0;
    pVVar1 = (Value *)0x0;
  }
  else {
    (*(stmt->super_ASTNode)._vptr_ASTNode[2])(stmt,this);
    pVVar1 = this->result_;
  }
  return pVVar1;
}

Assistant:

Value* IRGenerator::codegen(Stmt* stmt) {
  if (stmt) {
    stmt->visit(*this);
  } else {
    result_ = nullptr;
  }
  return result_;
}